

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v7::detail::snprintf_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  char *pcVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  uint uVar5;
  undefined2 *puVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  char *pcVar13;
  ulong unaff_R12;
  char *__s;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  char format [7];
  char local_63;
  undefined1 local_62 [2];
  undefined1 auStack_60 [4];
  uint local_5c;
  long local_58;
  size_t local_50;
  longdouble local_44;
  ulong local_38;
  
  local_44 = value;
  local_38 = (ulong)specs >> 0x20;
  uVar5 = 5;
  if (-1 < precision) {
    uVar5 = precision - 1;
  }
  bVar11 = specs._4_1_;
  uVar15 = (ulong)uVar5;
  if (1 < bVar11) {
    uVar15 = (ulong)(uint)precision;
  }
  local_63 = '%';
  if (bVar11 == 3 && (specs._4_4_ >> 0x14 & 1) != 0) {
    puVar6 = (undefined2 *)(local_62 + 1);
    local_62[0] = 0x23;
  }
  else {
    puVar6 = (undefined2 *)local_62;
  }
  iVar14 = (int)uVar15;
  if (-1 < iVar14) {
    *puVar6 = 0x2a2e;
    puVar6 = puVar6 + 1;
  }
  *(undefined1 *)puVar6 = 0x4c;
  if (bVar11 == 3) {
    bVar8 = ((specs._4_4_ >> 0x10 & 1) == 0) << 5 | 0x41;
  }
  else {
    bVar8 = (bVar11 == 2) + 0x65;
  }
  *(byte *)((long)puVar6 + 1) = bVar8;
  *(undefined1 *)(puVar6 + 1) = 0;
  local_50 = buf->size_;
  local_58 = local_50 + 1;
  local_5c = (uint)bVar11;
  do {
    __s = buf->ptr_ + local_50;
    uVar10 = buf->capacity_ - local_50;
    if (iVar14 < 0) {
      uVar5 = snprintf(__s,uVar10,&local_63);
    }
    else {
      uVar5 = snprintf(__s,uVar10,&local_63,uVar15);
    }
    uVar16 = (ulong)uVar5;
    if ((int)uVar5 < 0) {
      bVar3 = true;
      if (buf->capacity_ != 0xffffffffffffffff) {
        (**buf->_vptr_buffer)(buf,buf->capacity_ + 1);
      }
    }
    else if (uVar16 < uVar10) {
      if ((char)local_38 == '\x02') {
        if (iVar14 == 0) goto LAB_0018fd4b;
        unaff_R12 = 1;
        do {
          lVar4 = unaff_R12 + (uVar16 - 2);
          unaff_R12 = unaff_R12 - 1;
        } while ((byte)(__s[lVar4] - 0x30U) < 10);
        memmove(__s + unaff_R12 + uVar16 + -1,__s + unaff_R12 + uVar16,(ulong)(uint)-(int)unaff_R12)
        ;
        uVar10 = (ulong)(uVar5 - 1);
        if (buf->capacity_ < uVar10) {
          (**buf->_vptr_buffer)(buf,uVar10);
        }
        if (buf->capacity_ < uVar10) {
          uVar10 = buf->capacity_;
        }
        buf->size_ = uVar10;
        bVar3 = false;
      }
      else if (local_5c == 3) {
        uVar16 = uVar16 + local_50;
LAB_0018fd4b:
        if (buf->capacity_ < uVar16) {
          (**buf->_vptr_buffer)(buf,uVar16);
        }
        if (buf->capacity_ < uVar16) {
          uVar16 = buf->capacity_;
        }
        buf->size_ = uVar16;
        bVar3 = false;
        unaff_R12 = 0;
      }
      else {
        uVar7 = 1;
        uVar10 = uVar16 - 2;
        lVar4 = 1;
        pcVar1 = __s;
        do {
          pcVar13 = pcVar1;
          lVar9 = lVar4;
          uVar17 = uVar10;
          uVar7 = uVar7 + 1;
          uVar10 = uVar17 - 1;
          lVar4 = lVar9 + -1;
          pcVar1 = pcVar13 + -1;
        } while (pcVar13[uVar16 - 1] != 'e');
        iVar12 = 0;
        do {
          iVar12 = (int)__s[lVar9 + uVar16] + iVar12 * 10 + -0x30;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0);
        iVar2 = -iVar12;
        if (pcVar13[uVar16] != '-') {
          iVar2 = iVar12;
        }
        uVar5 = 0;
        if (uVar16 != uVar7) {
          do {
            pcVar1 = __s + uVar17;
            uVar17 = uVar17 - 1;
          } while (*pcVar1 == '0');
          memmove(__s + 1,__s + 2,uVar17 & 0xffffffff);
          uVar5 = (uint)uVar17;
        }
        uVar10 = (ulong)uVar5 + local_58;
        if (buf->capacity_ < uVar10) {
          (**buf->_vptr_buffer)(buf,uVar10);
        }
        if (buf->capacity_ < uVar10) {
          uVar10 = buf->capacity_;
        }
        buf->size_ = uVar10;
        unaff_R12 = (ulong)(iVar2 - uVar5);
        bVar3 = false;
      }
    }
    else {
      bVar3 = true;
      if (buf->capacity_ < uVar16 + local_58) {
        (**buf->_vptr_buffer)(buf,uVar16 + local_58);
      }
    }
    if (!bVar3) {
      return (int)unaff_R12;
    }
  } while( true );
}

Assistant:

int snprintf_float(T value, int precision, float_specs specs,
                   buffer<char>& buf) {
  // Buffer capacity must be non-zero, otherwise MSVC's vsnprintf_s will fail.
  FMT_ASSERT(buf.capacity() > buf.size(), "empty buffer");
  static_assert(!std::is_same<T, float>::value, "");

  // Subtract 1 to account for the difference in precision since we use %e for
  // both general and exponent format.
  if (specs.format == float_format::general ||
      specs.format == float_format::exp)
    precision = (precision >= 0 ? precision : 6) - 1;

  // Build the format string.
  enum { max_format_size = 7 };  // The longest format is "%#.*Le".
  char format[max_format_size];
  char* format_ptr = format;
  *format_ptr++ = '%';
  if (specs.showpoint && specs.format == float_format::hex) *format_ptr++ = '#';
  if (precision >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }
  if (std::is_same<T, long double>()) *format_ptr++ = 'L';
  *format_ptr++ = specs.format != float_format::hex
                      ? (specs.format == float_format::fixed ? 'f' : 'e')
                      : (specs.upper ? 'A' : 'a');
  *format_ptr = '\0';

  // Format using snprintf.
  auto offset = buf.size();
  for (;;) {
    auto begin = buf.data() + offset;
    auto capacity = buf.capacity() - offset;
#ifdef FMT_FUZZ
    if (precision > 100000)
      throw std::runtime_error(
          "fuzz mode - avoid large allocation inside snprintf");
#endif
    // Suppress the warning about a nonliteral format string.
    // Cannot use auto because of a bug in MinGW (#1532).
    int (*snprintf_ptr)(char*, size_t, const char*, ...) = FMT_SNPRINTF;
    int result = precision >= 0
                     ? snprintf_ptr(begin, capacity, format, precision, value)
                     : snprintf_ptr(begin, capacity, format, value);
    if (result < 0) {
      // The buffer will grow exponentially.
      buf.try_reserve(buf.capacity() + 1);
      continue;
    }
    auto size = to_unsigned(result);
    // Size equal to capacity means that the last character was truncated.
    if (size >= capacity) {
      buf.try_reserve(size + offset + 1);  // Add 1 for the terminating '\0'.
      continue;
    }
    auto is_digit = [](char c) { return c >= '0' && c <= '9'; };
    if (specs.format == float_format::fixed) {
      if (precision == 0) {
        buf.try_resize(size);
        return 0;
      }
      // Find and remove the decimal point.
      auto end = begin + size, p = end;
      do {
        --p;
      } while (is_digit(*p));
      int fraction_size = static_cast<int>(end - p - 1);
      std::memmove(p, p + 1, to_unsigned(fraction_size));
      buf.try_resize(size - 1);
      return -fraction_size;
    }
    if (specs.format == float_format::hex) {
      buf.try_resize(size + offset);
      return 0;
    }
    // Find and parse the exponent.
    auto end = begin + size, exp_pos = end;
    do {
      --exp_pos;
    } while (*exp_pos != 'e');
    char sign = exp_pos[1];
    assert(sign == '+' || sign == '-');
    int exp = 0;
    auto p = exp_pos + 2;  // Skip 'e' and sign.
    do {
      assert(is_digit(*p));
      exp = exp * 10 + (*p++ - '0');
    } while (p != end);
    if (sign == '-') exp = -exp;
    int fraction_size = 0;
    if (exp_pos != begin + 1) {
      // Remove trailing zeros.
      auto fraction_end = exp_pos - 1;
      while (*fraction_end == '0') --fraction_end;
      // Move the fractional part left to get rid of the decimal point.
      fraction_size = static_cast<int>(fraction_end - begin - 1);
      std::memmove(begin + 1, begin + 2, to_unsigned(fraction_size));
    }
    buf.try_resize(to_unsigned(fraction_size) + offset + 1);
    return exp - fraction_size;
  }
}